

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIs64Bit(cmMakefile *this)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue sizeof_dptr;
  cmMakefile *this_local;
  
  sizeof_dptr.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SIZEOF_VOID_P",&local_41);
  local_20 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_20);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    this_local._7_1_ = iVar2 == 8;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PlatformIs64Bit() const
{
  if (cmValue sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr->c_str()) == 8;
  }
  return false;
}